

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

ColumnRef __thiscall clickhouse::ColumnDateTime::Slice(ColumnDateTime *this,size_t begin,size_t len)

{
  _func_int *p_Var1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *peVar4;
  long lVar5;
  ColumnRef CVar6;
  _func_int **local_48;
  element_type *peStack_40;
  long local_38;
  element_type *local_30;
  long local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  (**(code **)(**(long **)(begin + 0x28) + 0x38))(&local_28);
  std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<clickhouse::Column,void>
            ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  if (local_48 == (_func_int **)0x0) {
    peVar4 = (element_type *)0x0;
    lVar5 = 0;
  }
  else {
    lVar2 = __dynamic_cast(local_48,&Column::typeinfo,&ColumnVector<unsigned_int>::typeinfo,0);
    peVar4 = (element_type *)0x0;
    lVar5 = 0;
    if (lVar2 != 0) {
      lVar5 = lVar2;
      if (peStack_40 == (element_type *)0x0) {
        peVar4 = (element_type *)0x0;
      }
      else {
        peVar4 = peStack_40;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(peStack_40->super_enable_shared_from_this<clickhouse::Column>)._M_weak_this.
                   super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peStack_40->super_enable_shared_from_this<clickhouse::Column>)._M_weak_this
                        .super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
          UNLOCK();
        }
        else {
          *(int *)&(peStack_40->super_enable_shared_from_this<clickhouse::Column>)._M_weak_this.
                   super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peStack_40->super_enable_shared_from_this<clickhouse::Column>)._M_weak_this
                        .super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
        }
      }
    }
  }
  if (peStack_40 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_40);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  std::__shared_ptr<clickhouse::ColumnDateTime,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<clickhouse::ColumnDateTime>>
            ((__shared_ptr<clickhouse::ColumnDateTime,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (allocator<clickhouse::ColumnDateTime> *)&local_28);
  p_Var1 = local_48[5];
  if (peVar4 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(peVar4->super_enable_shared_from_this<clickhouse::Column>)._M_weak_this.
               super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(peVar4->super_enable_shared_from_this<clickhouse::Column>)._M_weak_this.
                    super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(peVar4->super_enable_shared_from_this<clickhouse::Column>)._M_weak_this.
               super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(peVar4->super_enable_shared_from_this<clickhouse::Column>)._M_weak_this.
                    super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  local_38 = lVar5;
  local_30 = peVar4;
  (**(code **)(*(long *)p_Var1 + 0x10))(p_Var1,&local_38);
  _Var3._M_pi = extraout_RDX;
  if (local_30 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
    _Var3._M_pi = extraout_RDX_00;
  }
  (this->super_Column)._vptr_Column = local_48;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_40;
  if (peVar4 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4);
    _Var3._M_pi = extraout_RDX_01;
  }
  CVar6.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  CVar6.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Column;
  return (ColumnRef)CVar6.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnDateTime::Slice(size_t begin, size_t len) {
    auto col = data_->Slice(begin, len)->As<ColumnUInt32>();
    auto result = std::make_shared<ColumnDateTime>();

    result->data_->Append(col);

    return result;
}